

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void fe_cmov_test(void)

{
  int iVar1;
  secp256k1_fe a;
  secp256k1_fe r;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined4 local_8;
  
  memset(&local_30,0,0x30);
  local_30 = 0xfffffffffffff;
  local_28 = 0xfffffffffffff;
  local_20 = 0xfffffffffffff;
  local_18 = 0xfffffffffffff;
  local_10 = 0xffffffffffff;
  local_8 = 1;
  memset(&stack0xffffffffffffffa0,0,0x30);
  secp256k1_fe_cmov(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  iVar1 = fe_identical(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d79,"test condition failed: fe_identical(&r, &max)");
    abort();
  }
  memcpy(&local_30,&fe_cmov_test::zero,0x30);
  memcpy(&stack0xffffffffffffffa0,&fe_cmov_test::max,0x30);
  secp256k1_fe_cmov(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  iVar1 = fe_identical(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d7d,"test condition failed: fe_identical(&r, &max)");
    abort();
  }
  memcpy(&stack0xffffffffffffffa0,&fe_cmov_test::zero,0x30);
  secp256k1_fe_cmov(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  iVar1 = fe_identical(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d81,"test condition failed: fe_identical(&r, &zero)");
    abort();
  }
  memcpy(&stack0xffffffffffffffa0,&fe_cmov_test::one,0x30);
  secp256k1_fe_cmov(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  iVar1 = fe_identical(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d85,"test condition failed: fe_identical(&r, &one)");
    abort();
  }
  memcpy(&local_30,&fe_cmov_test::one,0x30);
  memcpy(&stack0xffffffffffffffa0,&fe_cmov_test::zero,0x30);
  secp256k1_fe_cmov(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  iVar1 = fe_identical(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d89,"test condition failed: fe_identical(&r, &one)");
    abort();
  }
  return;
}

Assistant:

static void fe_cmov_test(void) {
    static const secp256k1_fe zero = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    static const secp256k1_fe one = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    static const secp256k1_fe max = SECP256K1_FE_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL,
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL
    );
    secp256k1_fe r = max;
    secp256k1_fe a = zero;

    secp256k1_fe_cmov(&r, &a, 0);
    CHECK(fe_identical(&r, &max));

    r = zero; a = max;
    secp256k1_fe_cmov(&r, &a, 1);
    CHECK(fe_identical(&r, &max));

    a = zero;
    secp256k1_fe_cmov(&r, &a, 1);
    CHECK(fe_identical(&r, &zero));

    a = one;
    secp256k1_fe_cmov(&r, &a, 1);
    CHECK(fe_identical(&r, &one));

    r = one; a = zero;
    secp256k1_fe_cmov(&r, &a, 0);
    CHECK(fe_identical(&r, &one));
}